

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

uint16_t chk_flags(char *s)

{
  int iVar1;
  uint16_t uVar2;
  
  iVar1 = strcmp(s + 5,"deluscore");
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    iVar1 = strcmp(s + 5,"adduscore");
    if (iVar1 == 0) {
      uVar2 = 2;
    }
    else {
      uVar2 = 0;
      error(2,s);
    }
  }
  return uVar2;
}

Assistant:

static uint16_t chk_flags(char *s)
/* check for input-file flags */
{
  if (!strcmp(s+5,"deluscore"))
    return IFF_DELUNDERSCORE;

  else if (!strcmp(s+5,"adduscore"))
    return IFF_ADDUNDERSCORE;

  error(2,s);
  return 0;
}